

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageTimer.cpp
# Opt level: O0

void __thiscall
helics::MessageTimer::updateMessage(MessageTimer *this,int32_t timerIndex,ActionMessage *mess)

{
  size_type sVar1;
  ActionMessage *in_RDX;
  int in_ESI;
  long in_RDI;
  lock_guard<std::mutex> lock;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  int iVar2;
  
  CLI::std::lock_guard<std::mutex>::lock_guard
            ((lock_guard<std::mutex> *)in_RDX,
             (mutex_type *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
  if (-1 < in_ESI) {
    iVar2 = in_ESI;
    sVar1 = std::
            vector<std::shared_ptr<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>_>,_std::allocator<std::shared_ptr<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>_>_>_>
            ::size((vector<std::shared_ptr<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>_>,_std::allocator<std::shared_ptr<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>_>_>_>
                    *)(in_RDI + 0x88));
    if (iVar2 < (int)sVar1) {
      std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>::operator[]
                ((vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_> *)
                 (in_RDI + 0x38),(long)in_ESI);
      ActionMessage::operator=(in_RDX,(ActionMessage *)CONCAT44(iVar2,in_stack_ffffffffffffffc8));
    }
  }
  CLI::std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x6933c4);
  return;
}

Assistant:

void MessageTimer::updateMessage(int32_t timerIndex, ActionMessage mess)
{
    std::lock_guard<std::mutex> lock(timerLock);
    if ((timerIndex >= 0) && (timerIndex < static_cast<int32_t>(timers.size()))) {
        buffers[timerIndex] = std::move(mess);
    }
}